

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void put_short_code(DynBuf *bc_out,int op,int idx)

{
  int in_EDX;
  int in_ESI;
  uint16_t in_stack_ffffffffffffffde;
  uint8_t c;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  c = (uint8_t)(in_stack_ffffffffffffffde >> 8);
  if (in_EDX < 4) {
    switch(in_ESI) {
    case 0x22:
      dbuf_putc((DynBuf *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),c);
      return;
    default:
      break;
    case 0x58:
      dbuf_putc((DynBuf *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),c);
      return;
    case 0x59:
      dbuf_putc((DynBuf *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),c);
      return;
    case 0x5a:
      dbuf_putc((DynBuf *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),c);
      return;
    case 0x5b:
      dbuf_putc((DynBuf *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),c);
      return;
    case 0x5c:
      dbuf_putc((DynBuf *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),c);
      return;
    case 0x5d:
      dbuf_putc((DynBuf *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),c);
      return;
    case 0x5e:
      dbuf_putc((DynBuf *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),c);
      return;
    case 0x5f:
      dbuf_putc((DynBuf *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),c);
      return;
    case 0x60:
      dbuf_putc((DynBuf *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),c);
      return;
    }
  }
  if (in_EDX < 0x100) {
    if (in_ESI == 0x58) {
      dbuf_putc((DynBuf *)CONCAT44(0x58,in_stack_ffffffffffffffe0),c);
      dbuf_putc((DynBuf *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),
                (uint8_t)(in_stack_ffffffffffffffde >> 8));
      return;
    }
    if (in_ESI == 0x59) {
      dbuf_putc((DynBuf *)CONCAT44(0x59,in_stack_ffffffffffffffe0),c);
      dbuf_putc((DynBuf *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),
                (uint8_t)(in_stack_ffffffffffffffde >> 8));
      return;
    }
    in_stack_ffffffffffffffe4 = in_ESI;
    if (in_ESI == 0x5a) {
      dbuf_putc((DynBuf *)CONCAT44(0x5a,in_stack_ffffffffffffffe0),c);
      dbuf_putc((DynBuf *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),
                (uint8_t)(in_stack_ffffffffffffffde >> 8));
      return;
    }
  }
  dbuf_putc((DynBuf *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),c);
  dbuf_put_u16((DynBuf *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffde);
  return;
}

Assistant:

static void put_short_code(DynBuf *bc_out, int op, int idx)
{
#if SHORT_OPCODES
    if (idx < 4) {
        switch (op) {
        case OP_get_loc:
            dbuf_putc(bc_out, OP_get_loc0 + idx);
            return;
        case OP_put_loc:
            dbuf_putc(bc_out, OP_put_loc0 + idx);
            return;
        case OP_set_loc:
            dbuf_putc(bc_out, OP_set_loc0 + idx);
            return;
        case OP_get_arg:
            dbuf_putc(bc_out, OP_get_arg0 + idx);
            return;
        case OP_put_arg:
            dbuf_putc(bc_out, OP_put_arg0 + idx);
            return;
        case OP_set_arg:
            dbuf_putc(bc_out, OP_set_arg0 + idx);
            return;
        case OP_get_var_ref:
            dbuf_putc(bc_out, OP_get_var_ref0 + idx);
            return;
        case OP_put_var_ref:
            dbuf_putc(bc_out, OP_put_var_ref0 + idx);
            return;
        case OP_set_var_ref:
            dbuf_putc(bc_out, OP_set_var_ref0 + idx);
            return;
        case OP_call:
            dbuf_putc(bc_out, OP_call0 + idx);
            return;
        }
    }
    if (idx < 256) {
        switch (op) {
        case OP_get_loc:
            dbuf_putc(bc_out, OP_get_loc8);
            dbuf_putc(bc_out, idx);
            return;
        case OP_put_loc:
            dbuf_putc(bc_out, OP_put_loc8);
            dbuf_putc(bc_out, idx);
            return;
        case OP_set_loc:
            dbuf_putc(bc_out, OP_set_loc8);
            dbuf_putc(bc_out, idx);
            return;
        }
    }
#endif
    dbuf_putc(bc_out, op);
    dbuf_put_u16(bc_out, idx);
}